

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buchb.h
# Opt level: O1

void __thiscall
GF2::CritPair<137UL,_GF2::MOGrlex<137UL>_>::GetSPoly
          (CritPair<137UL,_GF2::MOGrlex<137UL>_> *this,MP<137UL,_GF2::MOGrlex<137UL>_> *spoly)

{
  size_t i;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  long lVar4;
  
  p_Var3 = (this->field_1).iter2._M_node + 1;
  if (p_Var3 != (_List_node_base *)spoly) {
    std::__cxx11::list<GF2::MM<137ul>,std::allocator<GF2::MM<137ul>>>::
    _M_assign_dispatch<std::_List_const_iterator<GF2::MM<137ul>>>
              ((list<GF2::MM<137ul>,std::allocator<GF2::MM<137ul>>> *)spoly,
               (((list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_> *)&p_Var3->_M_next)->
               super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>)._M_impl._M_node.
               super__List_node_base._M_next);
  }
  i = (this->field_0).var1;
  if (i == 0xffffffffffffffff) {
    MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly
              (spoly,(MP<137UL,_GF2::MOGrlex<137UL>_> *)((this->field_0).iter1._M_node + 1));
    return;
  }
  MP<137UL,_GF2::MOGrlex<137UL>_>::SPoly(spoly,i);
  if ((spoly->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
      super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl._M_node._M_size !=
      0) {
    p_Var3 = (this->field_1).iter2._M_node;
    lVar4 = 4;
    do {
      p_Var1 = *(_List_node_base **)
                ((long)&((spoly->super_list<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>).
                         super__List_base<GF2::MM<137UL>,_std::allocator<GF2::MM<137UL>_>_>._M_impl.
                         _M_node.super__List_node_base._M_next)->_M_next + lVar4 * 8);
      p_Var2 = (&(p_Var3[1]._M_next)->_M_next)[lVar4];
      if (lVar4 == 2) break;
      lVar4 = lVar4 + -1;
    } while (p_Var1 == p_Var2);
    if (p_Var1 == p_Var2) {
      MP<137UL,_GF2::MOGrlex<137UL>_>::SymDiff
                (spoly,(MP<137UL,_GF2::MOGrlex<137UL>_> *)(p_Var3 + 1));
      return;
    }
  }
  return;
}

Assistant:

void GetSPoly(MP<_n, _O>& spoly) const
	{
		spoly.SetOrder(iter2->GetOrder());
		spoly = *iter2;
		if (var1 == SIZE_MAX)
			// S-многочлен для пары явных многочленов
			spoly.SPoly(*iter1);
		else
		{
			// S(x_i^2-x_i, f) = f x_i mod (x_i^2-x_i)
			spoly.SPoly(var1);
			if (spoly != 0 && spoly.LM() == iter2->LM())
				spoly += *iter2;
		}
	}